

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_options.c
# Opt level: O1

int archive_set_filter_option(archive *_a,char *m,char *o,char *v)

{
  code *pcVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  
  sVar4 = _a[1].error_string.buffer_length;
  if (sVar4 == 0) {
    iVar3 = -0x14;
  }
  else {
    iVar3 = -0x14;
    do {
      pcVar1 = *(code **)(sVar4 + 0x18);
      if ((pcVar1 != (code *)0x0) &&
         ((m == (char *)0x0 || (iVar2 = strcmp(*(char **)(sVar4 + 0x48),m), iVar2 == 0)))) {
        iVar2 = (*pcVar1)(sVar4,o,v);
        if (m != (char *)0x0) {
          return iVar2;
        }
        if (iVar2 == -0x1e) {
          return -0x1e;
        }
        if (iVar2 == 0) {
          iVar3 = 0;
        }
      }
      sVar4 = *(size_t *)(sVar4 + 0x10);
    } while (sVar4 != 0);
  }
  iVar2 = -0x15;
  if (iVar3 != -0x14) {
    iVar2 = iVar3;
  }
  if (m == (char *)0x0) {
    iVar2 = iVar3;
  }
  return iVar2;
}

Assistant:

static int
archive_set_filter_option(struct archive *_a, const char *m, const char *o,
    const char *v)
{
	struct archive_write *a = (struct archive_write *)_a;
	struct archive_write_filter *filter;
	int r, rv = ARCHIVE_WARN;

	for (filter = a->filter_first; filter != NULL; filter = filter->next_filter) {
		if (filter->options == NULL)
			continue;
		if (m != NULL && strcmp(filter->name, m) != 0)
			continue;

		r = filter->options(filter, o, v);

		if (r == ARCHIVE_FATAL)
			return (ARCHIVE_FATAL);

		if (m != NULL)
			return (r);

		if (r == ARCHIVE_OK)
			rv = ARCHIVE_OK;
	}
	/* If the filter name didn't match, return a special code for
	 * _archive_set_option[s]. */
	if (rv == ARCHIVE_WARN && m != NULL)
		rv = ARCHIVE_WARN - 1;
	return (rv);
}